

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BothInclusiveBetweenOperator,true,true,true>
                (hugeint_t *adata,hugeint_t *bdata,hugeint_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  hugeint_t upper;
  hugeint_t input;
  hugeint_t lower;
  bool bVar1;
  int64_t unaff_RBX;
  idx_t iVar2;
  uint64_t uVar3;
  long lVar4;
  idx_t i;
  uint64_t uVar5;
  uint64_t in_stack_ffffffffffffffa8;
  
  lVar4 = 0;
  iVar2 = 0;
  for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
    uVar3 = uVar5;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar3 = (uint64_t)result_sel->sel_vector[uVar5];
    }
    input.upper = (int64_t)asel;
    input.lower = (uint64_t)result_sel;
    lower.upper = unaff_RBX;
    lower.lower = count;
    upper.upper = (int64_t)cdata;
    upper.lower = in_stack_ffffffffffffffa8;
    bVar1 = BothInclusiveBetweenOperator::Operation<duckdb::hugeint_t>(input,lower,upper);
    true_sel->sel_vector[iVar2] = (sel_t)uVar3;
    iVar2 = iVar2 + bVar1;
    false_sel->sel_vector[lVar4] = (sel_t)uVar3;
    lVar4 = lVar4 + (ulong)!bVar1;
  }
  return iVar2;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}